

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_frigidaura(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_frigidaura);
  if (bVar1) {
    send_to_char("You are already surrounded by an aura of cold.\n\r",ch);
    return;
  }
  init_affect(&af);
  af.where = 3;
  af.aftype = 0;
  af.location = 0;
  af.modifier = 0;
  af.level = (short)level;
  af.duration = (short)(level / 3);
  af.mod_name = 0xc;
  af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 1;
  af.type = (short)sn;
  affect_to_char(ch,&af);
  af.where = 4;
  zero_vector(af.bitvector);
  af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 0x80;
  affect_to_char(ch,&af);
  act("You chill the air around you, prepared to lash out at any who come near.",ch,(void *)0x0,
      (void *)0x0,3);
  act("$n is briefly surrounded by an aura of ice, which rapidly fades away.",ch,(void *)0x0,
      (void *)0x0,0);
  return;
}

Assistant:

void spell_frigidaura(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_frigidaura))
	{
		send_to_char("You are already surrounded by an aura of cold.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_RESIST;
	af.type = sn;
	af.aftype = AFT_SPELL;
	af.location = 0;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 3;
	af.mod_name = MOD_RESISTANCE;

	SET_BIT(af.bitvector, RES_COLD);

	affect_to_char(ch, &af);

	af.where = TO_VULN;
	zero_vector(af.bitvector);

	SET_BIT(af.bitvector, VULN_FIRE);

	affect_to_char(ch, &af);

	act("You chill the air around you, prepared to lash out at any who come near.", ch, 0, 0, TO_CHAR);
	act("$n is briefly surrounded by an aura of ice, which rapidly fades away.", ch, 0, 0, TO_ROOM);
}